

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O0

string * __thiscall
cppcms::session_interface::get_csrf_token_cookie_name_abi_cxx11_(session_interface *this)

{
  string *in_RDI;
  char *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  session_interface *in_stack_ffffffffffffffd8;
  
  cached_settings(in_stack_ffffffffffffffd8);
  std::operator+(in_stack_00000008,unaff_retaddr);
  return in_RDI;
}

Assistant:

std::string session_interface::get_csrf_token_cookie_name()
{
	return cached_settings().session.cookies.prefix + "__csrf"; // one for suffix and one for _csrf
}